

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::CenterZoomSearchResults(BoardView *this)

{
  Point PVar1;
  pointer psVar2;
  element_type *peVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  shared_ptr<Pin> *pp;
  pointer psVar9;
  pointer psVar10;
  ulong uVar11;
  shared_ptr<Pin> *pn;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar15;
  undefined1 auVar14 [16];
  float fVar19;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar20;
  undefined1 auVar18 [16];
  float fVar21;
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  if ((this->config).showPins == false) {
    (this->config).showPins = true;
  }
  if ((this->config).centerZoomSearchResults == true) {
    auVar22._8_8_ = 0;
    auVar22._0_4_ = (this->m_board_surface).x;
    auVar22._4_4_ = (this->m_board_surface).y;
    psVar9 = (this->m_pinHighlighted).
             super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->m_pinHighlighted).
             super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar11 = (ulong)((long)psVar2 - (long)psVar9) >> 4;
    fVar23 = 1.1754944e-38;
    fVar25 = 1.1754944e-38;
    fVar21 = 0.0;
    fVar15 = 0.0;
    fVar24 = 3.4028235e+38;
    fVar26 = 3.4028235e+38;
    fVar19 = 0.0;
    fVar20 = 0.0;
    for (; psVar9 != psVar2; psVar9 = psVar9 + 1) {
      PVar1 = ((psVar9->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->position;
      auVar12._8_8_ = 0;
      auVar12._0_4_ = PVar1.x;
      auVar12._4_4_ = PVar1.y;
      auVar16._8_8_ = 0;
      auVar16._0_4_ = PVar1.x;
      auVar16._4_4_ = PVar1.y;
      auVar6._4_4_ = fVar26;
      auVar6._0_4_ = fVar24;
      auVar6._8_4_ = fVar19;
      auVar6._12_4_ = fVar20;
      auVar17 = minps(auVar16,auVar6);
      auVar4._4_4_ = fVar25;
      auVar4._0_4_ = fVar23;
      auVar4._8_4_ = fVar21;
      auVar4._12_4_ = fVar15;
      auVar13 = maxps(auVar12,auVar4);
      fVar24 = auVar17._0_4_;
      fVar26 = auVar17._4_4_;
      fVar19 = auVar17._8_4_;
      fVar20 = auVar17._12_4_;
      fVar23 = auVar13._0_4_;
      fVar25 = auVar13._4_4_;
      fVar21 = auVar13._8_4_;
      fVar15 = auVar13._12_4_;
    }
    for (psVar10 = (this->m_partHighlighted).
                   super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        psVar10 !=
        (this->m_partHighlighted).
        super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; psVar10 = psVar10 + 1) {
      peVar3 = (psVar10->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      for (psVar9 = (peVar3->pins).
                    super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar9 != (peVar3->pins).
                    super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; psVar9 = psVar9 + 1) {
        PVar1 = ((psVar9->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->position;
        auVar14._8_8_ = 0;
        auVar14._0_4_ = PVar1.x;
        auVar14._4_4_ = PVar1.y;
        auVar18._8_8_ = 0;
        auVar18._0_4_ = PVar1.x;
        auVar18._4_4_ = PVar1.y;
        auVar7._4_4_ = fVar26;
        auVar7._0_4_ = fVar24;
        auVar7._8_4_ = fVar19;
        auVar7._12_4_ = fVar20;
        auVar17 = minps(auVar18,auVar7);
        auVar5._4_4_ = fVar25;
        auVar5._0_4_ = fVar23;
        auVar5._8_4_ = fVar21;
        auVar5._12_4_ = fVar15;
        auVar13 = maxps(auVar14,auVar5);
        uVar11 = (ulong)((int)uVar11 + 1);
        fVar24 = auVar17._0_4_;
        fVar26 = auVar17._4_4_;
        fVar19 = auVar17._8_4_;
        fVar20 = auVar17._12_4_;
        fVar23 = auVar13._0_4_;
        fVar25 = auVar13._4_4_;
        fVar21 = auVar13._8_4_;
        fVar15 = auVar13._12_4_;
      }
    }
    auVar13._4_4_ = -(uint)(fVar26 == 3.4028235e+38);
    auVar13._0_4_ = -(uint)(fVar24 == 3.4028235e+38);
    auVar13._8_4_ = -(uint)(fVar23 == 1.1754944e-38);
    auVar13._12_4_ = -(uint)(fVar25 == 1.1754944e-38);
    iVar8 = movmskps((int)psVar10,auVar13);
    if (iVar8 == 0) {
      if (this->debug == true) {
        fprintf(_stderr,"CenterzoomSearchResults: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n",
                (double)fVar24,(double)fVar26,(double)fVar23,SUB84((double)fVar25,0),uVar11);
      }
      fVar23 = fVar23 - fVar24;
      fVar25 = fVar25 - fVar26;
      auVar17._4_4_ = fVar25;
      auVar17._0_4_ = fVar23;
      auVar17._8_4_ = fVar21 - fVar19;
      auVar17._12_4_ = fVar15 - fVar20;
      auVar22 = divps(auVar22,auVar17);
      fVar21 = (float)(~-(uint)(0.0 < fVar23) & 0x7f7fffff | auVar22._0_4_ & -(uint)(0.0 < fVar23));
      fVar15 = (float)(~-(uint)(0.0 < fVar25) & 0x7f7fffff | auVar22._4_4_ & -(uint)(0.0 < fVar25));
      if (fVar15 <= fVar21) {
        fVar21 = fVar15;
      }
      fVar15 = this->m_scale_floor;
      fVar21 = (float)(-(uint)(fVar21 == 3.4028235e+38) & (uint)fVar15 |
                      ~-(uint)(fVar21 == 3.4028235e+38) & (uint)fVar21) /
               (this->config).partZoomScaleOutFactor;
      if (fVar15 <= fVar21) {
        fVar15 = fVar21;
      }
      this->m_scale = fVar15;
      fVar24 = fVar23 * 0.5 + fVar24;
      fVar26 = fVar25 * 0.5 + fVar26;
      this->m_dx = fVar24;
      this->m_dy = fVar26;
      SetTarget(this,fVar24,fVar26);
      this->m_needsRedraw = true;
    }
  }
  return;
}

Assistant:

void BoardView::CenterZoomSearchResults(void) {
	// ImVec2 view = ImGui::GetIO().DisplaySize;
	ImVec2 view = m_board_surface;
	ImVec2 min, max;
	int i = 0;

	if (!config.showPins) config.showPins = true; // Louis Rossmann UI failure fix.

	if (!config.centerZoomSearchResults) return;

	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;

	for (auto &pp : m_pinHighlighted) {
		auto &p = pp->position;
		if (p.x < min.x) min.x = p.x;
		if (p.y < min.y) min.y = p.y;
		if (p.x > max.x) max.x = p.x;
		if (p.y > max.y) max.y = p.y;
		i++;
	}

	for (auto &pp : m_partHighlighted) {
		for (auto &pn : pp->pins) {
			auto &p = pn->position;
			if (p.x < min.x) min.x = p.x;
			if (p.y < min.y) min.y = p.y;
			if (p.x > max.x) max.x = p.x;
			if (p.y > max.y) max.y = p.y;
			i++;
		}
	}

	// Bounds check!
	if ((min.x == FLT_MAX) || (min.y == FLT_MAX) || (max.x == FLT_MIN) || (max.y == FLT_MIN)) return;

	if (debug) fprintf(stderr, "CenterzoomSearchResults: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n", i, min.x, min.y, max.x, max.y);
	// fprintf(stderr, "CenterzoomSearchResults: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n", i, min.x, min.y, max.x, max.y);

	float dx = (max.x - min.x);
	float dy = (max.y - min.y);
	float sx = dx > 0 ? view.x / dx : FLT_MAX;
	float sy = dy > 0 ? view.y / dy : FLT_MAX;

	m_scale = sx < sy ? sx : sy;
	if (m_scale == FLT_MAX) m_scale = m_scale_floor;
	m_scale /= config.partZoomScaleOutFactor;
	if (m_scale < m_scale_floor) m_scale = m_scale_floor;

	m_dx = (max.x - min.x) / 2 + min.x;
	m_dy = (max.y - min.y) / 2 + min.y;
	SetTarget(m_dx, m_dy);
	m_needsRedraw = true;
}